

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_matrix.cpp
# Opt level: O0

Reals Omega_h::repeat_matrix<2>(LO n,Tensor<2> m)

{
  Vector<4> v_00;
  undefined4 in_register_0000003c;
  Reals RVar1;
  Reals RVar2;
  double local_a0;
  Vector<4> v;
  LO n_local;
  double local_70 [4];
  int local_50;
  int local_4c;
  Int j;
  Int i;
  double *local_40;
  int local_34;
  double *local_30;
  int local_24;
  double *local_20;
  int local_14;
  double *local_10;
  
  RVar2.write_.shared_alloc_.alloc._4_4_ = in_register_0000003c;
  RVar2.write_.shared_alloc_.alloc._0_4_ = n;
  local_70[0] = m.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0];
  local_70[1] = m.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1];
  local_70[2] = m.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[0];
  local_70[3] = m.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[1];
  for (local_4c = 0; local_4c < 2; local_4c = local_4c + 1) {
    for (local_50 = 0; local_50 < 2; local_50 = local_50 + 1) {
      i = local_4c;
      j = local_50;
      local_40 = local_70;
      local_34 = local_50;
      local_20 = local_40 + (long)local_50 * 2;
      local_24 = local_4c;
      local_14 = local_4c * 2 + local_50;
      local_10 = &local_a0;
      local_10[local_14] = local_20[local_4c];
      local_30 = local_40;
    }
  }
  v_00.super_Few<double,_4>.array_[1] = v.super_Few<double,_4>.array_[0];
  v_00.super_Few<double,_4>.array_[0] = local_a0;
  v_00.super_Few<double,_4>.array_[2] = v.super_Few<double,_4>.array_[1];
  v_00.super_Few<double,_4>.array_[3] = v.super_Few<double,_4>.array_[2];
  RVar1 = repeat_vector<4>(n,v_00);
  RVar2.write_.shared_alloc_.direct_ptr = RVar1.write_.shared_alloc_.direct_ptr;
  return (Reals)RVar2.write_.shared_alloc_;
}

Assistant:

Reals repeat_matrix(LO const n, Tensor<dim> const m) {
  return repeat_vector(n, matrix2vector(m));
}